

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

size_t google::protobuf::internal::(anonymous_namespace)::
       SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                 (KeyValue *it_xs,KeyValue *end_xs,
                 _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 it_ys,_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                       end_ys)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  if (it_ys._M_node != end_ys._M_node && it_xs != end_xs) {
    do {
      if (it_xs->first < (int)it_ys._M_node[1]._M_color) {
        it_xs = it_xs + 1;
      }
      else {
        if (it_xs->first == it_ys._M_node[1]._M_color) {
          it_xs = it_xs + 1;
        }
        it_ys._M_node = (_Base_ptr)std::_Rb_tree_increment(it_ys._M_node);
      }
      lVar1 = lVar1 + 1;
    } while ((it_xs != end_xs) && (it_ys._M_node != end_ys._M_node));
  }
  lVar2 = 0;
  while (it_ys._M_node != end_ys._M_node) {
    it_ys._M_node = (_Base_ptr)std::_Rb_tree_increment(it_ys._M_node);
    lVar2 = lVar2 + 1;
  }
  return ((long)end_xs - (long)it_xs >> 5) + lVar1 + lVar2;
}

Assistant:

size_t SizeOfUnion(ItX it_xs, ItX end_xs, ItY it_ys, ItY end_ys) {
  size_t result = 0;
  while (it_xs != end_xs && it_ys != end_ys) {
    ++result;
    if (it_xs->first < it_ys->first) {
      ++it_xs;
    } else if (it_xs->first == it_ys->first) {
      ++it_xs;
      ++it_ys;
    } else {
      ++it_ys;
    }
  }
  result += std::distance(it_xs, end_xs);
  result += std::distance(it_ys, end_ys);
  return result;
}